

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.h
# Opt level: O0

QMetaEnum QMetaEnum::fromType<QFlags<Qt::KeyboardModifier>>(void)

{
  long lVar1;
  QMetaEnum QVar2;
  QMetaObject *pQVar3;
  long in_FS_OFFSET;
  char *name;
  QMetaObject *metaObject;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<Qt::KeyboardModifier>::QFlags((QFlags<Qt::KeyboardModifier> *)0xa25988);
  pQVar3 = Qt::qt_getEnumMetaObject((KeyboardModifiers)0x0);
  QFlags<Qt::KeyboardModifier>::QFlags((QFlags<Qt::KeyboardModifier> *)0xa259a8);
  Qt::qt_getEnumName((KeyboardModifiers)0x0);
  QMetaObject::indexOfEnumerator((char *)pQVar3);
  QVar2 = (QMetaEnum)QMetaObject::enumerator((int)pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

static QMetaEnum fromType()
    {
        static_assert(QtPrivate::IsQEnumHelper<T>::Value,
                      "QMetaEnum::fromType only works with enums declared as "
                      "Q_ENUM, Q_ENUM_NS, Q_FLAG or Q_FLAG_NS");
        const QMetaObject *metaObject = qt_getEnumMetaObject(T());
        const char *name = qt_getEnumName(T());
        return metaObject->enumerator(metaObject->indexOfEnumerator(name));
    }